

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.cpp
# Opt level: O3

void __thiscall
QXcbEventQueue::waitForNewEvents
          (QXcbEventQueue *this,QXcbEventNode *sinceFlushedTail,unsigned_long time)

{
  QXcbEventQueue *pQVar1;
  long lVar2;
  
  pQVar1 = this + 0x78;
  if (*(long *)(this + 0x78) == 0) {
    LOCK();
    lVar2 = *(long *)pQVar1;
    if (lVar2 == 0) {
      *(long *)pQVar1 = 1;
    }
    UNLOCK();
    if (lVar2 == 0) goto LAB_0015bf88;
  }
  QBasicMutex::lockInternal();
LAB_0015bf88:
  *(QXcbEventNode **)(this + 0x18) = *(QXcbEventNode **)(this + 0x20);
  if (*(QXcbEventNode **)(this + 0x20) == sinceFlushedTail) {
    QWaitCondition::wait((QMutex *)(this + 0x80),(ulong)pQVar1);
  }
  LOCK();
  lVar2 = *(long *)pQVar1;
  *(long *)pQVar1 = 0;
  UNLOCK();
  if (lVar2 != 1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
    return;
  }
  return;
}

Assistant:

void QXcbEventQueue::waitForNewEvents(const QXcbEventNode *sinceFlushedTail,
                                      unsigned long time)
{
    QMutexLocker locker(&m_newEventsMutex);
    flushBufferedEvents();
    if (sinceFlushedTail != m_flushedTail)
        return;
    m_newEventsCondition.wait(&m_newEventsMutex, time);
}